

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

double __thiscall CMU462::Matrix4x4::det(Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double *pdVar93;
  Matrix4x4 *this_00;
  double dVar94;
  Matrix4x4 *A;
  undefined8 in_stack_fffffffffffffcf8;
  double dVar95;
  Matrix4x4 *in_stack_fffffffffffffd00;
  
  pdVar93 = operator()(in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                       (int)in_stack_fffffffffffffcf8);
  dVar95 = *pdVar93;
  pdVar93 = operator()(in_stack_fffffffffffffd00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  this_00 = (Matrix4x4 *)(dVar95 * *pdVar93);
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar94 = (double)this_00 * *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar1 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar2 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar3 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar4 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar5 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar6 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar7 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar8 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar9 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar10 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar11 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar12 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar13 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar14 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar15 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar16 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar17 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar18 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar19 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar20 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar21 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar22 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar23 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar24 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar25 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar26 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar27 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar28 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar29 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar30 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar31 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar32 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar33 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar34 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar35 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar36 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar37 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar38 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar39 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar40 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar41 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar42 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar43 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar44 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar45 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar46 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar47 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar48 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar49 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar50 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar51 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar52 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar53 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar54 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar55 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar56 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar57 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar58 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar59 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar60 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar61 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar62 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar63 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar64 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar65 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar66 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar67 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar68 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar69 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar70 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar71 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar72 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar73 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar74 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar75 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar76 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar77 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar78 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar79 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar80 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar81 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar82 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar83 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar84 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar85 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar86 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar87 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar88 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar89 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar90 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar91 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  dVar92 = *pdVar93;
  pdVar93 = operator()(this_00,(int)((ulong)dVar95 >> 0x20),SUB84(dVar95,0));
  return dVar90 * dVar91 * dVar92 * *pdVar93 +
         -(dVar86 * dVar87 * dVar88) * dVar89 +
         -(dVar82 * dVar83 * dVar84) * dVar85 +
         dVar78 * dVar79 * dVar80 * dVar81 +
         dVar74 * dVar75 * dVar76 * dVar77 +
         -(dVar70 * dVar71 * dVar72) * dVar73 +
         -(dVar66 * dVar67 * dVar68) * dVar69 +
         dVar62 * dVar63 * dVar64 * dVar65 +
         dVar58 * dVar59 * dVar60 * dVar61 +
         -(dVar54 * dVar55 * dVar56) * dVar57 +
         -(dVar50 * dVar51 * dVar52) * dVar53 +
         dVar46 * dVar47 * dVar48 * dVar49 +
         dVar42 * dVar43 * dVar44 * dVar45 +
         -(dVar38 * dVar39 * dVar40) * dVar41 +
         -(dVar34 * dVar35 * dVar36) * dVar37 +
         dVar30 * dVar31 * dVar32 * dVar33 +
         dVar26 * dVar27 * dVar28 * dVar29 +
         -(dVar22 * dVar23 * dVar24) * dVar25 +
         -(dVar18 * dVar19 * dVar20) * dVar21 +
         dVar14 * dVar15 * dVar16 * dVar17 +
         dVar10 * dVar11 * dVar12 * dVar13 +
         -(dVar6 * dVar7 * dVar8) * dVar9 + dVar94 * dVar1 + -(dVar2 * dVar3 * dVar4 * dVar5);
}

Assistant:

double Matrix4x4::det( void ) const {
    const Matrix4x4& A( *this );

	return
	  A(0,3)*A(1,2)*A(2,1)*A(3,0) - A(0,2)*A(1,3)*A(2,1)*A(3,0) -
	  A(0,3)*A(1,1)*A(2,2)*A(3,0) + A(0,1)*A(1,3)*A(2,2)*A(3,0) +
	  A(0,2)*A(1,1)*A(2,3)*A(3,0) - A(0,1)*A(1,2)*A(2,3)*A(3,0) -
	  A(0,3)*A(1,2)*A(2,0)*A(3,1) + A(0,2)*A(1,3)*A(2,0)*A(3,1) +
	  A(0,3)*A(1,0)*A(2,2)*A(3,1) - A(0,0)*A(1,3)*A(2,2)*A(3,1) -
	  A(0,2)*A(1,0)*A(2,3)*A(3,1) + A(0,0)*A(1,2)*A(2,3)*A(3,1) +
	  A(0,3)*A(1,1)*A(2,0)*A(3,2) - A(0,1)*A(1,3)*A(2,0)*A(3,2) -
	  A(0,3)*A(1,0)*A(2,1)*A(3,2) + A(0,0)*A(1,3)*A(2,1)*A(3,2) +
	  A(0,1)*A(1,0)*A(2,3)*A(3,2) - A(0,0)*A(1,1)*A(2,3)*A(3,2) -
	  A(0,2)*A(1,1)*A(2,0)*A(3,3) + A(0,1)*A(1,2)*A(2,0)*A(3,3) +
	  A(0,2)*A(1,0)*A(2,1)*A(3,3) - A(0,0)*A(1,2)*A(2,1)*A(3,3) -
	  A(0,1)*A(1,0)*A(2,2)*A(3,3) + A(0,0)*A(1,1)*A(2,2)*A(3,3);

  }